

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_sample_grad_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  initializer_list<unsigned_int> __l;
  Builder *this;
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  uint uVar4;
  Id IVar5;
  ImageOperandsMask IVar6;
  Value *pVVar7;
  Type *pTVar8;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  initializer_list<unsigned_int> local_138;
  Operation *local_128;
  Operation *splat_op;
  ComponentType tmp;
  Type *pTStack_118;
  Id loaded_id;
  Type *target_type;
  Operation *op;
  Id local_100;
  Op spv_op;
  Id dref_id;
  Id local_f4;
  iterator local_f0;
  undefined8 local_e8;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_e0;
  Id local_c4;
  Id local_c0;
  Id sample_type;
  Id texel_type;
  ComponentType effective_component_type;
  bool sparse;
  mapped_type *local_b0;
  mapped_type *access_meta;
  Id aux_argument;
  uint min_lod_argument_index;
  uint i_2;
  uint i_1;
  Id grad_y [3];
  Id grad_x [3];
  Id bias_id;
  uint grad_argument_index;
  Id offsets [3];
  uint i;
  Id coord [4];
  uint32_t local_50;
  uint32_t image_ops;
  uint num_coords;
  uint num_coords_full;
  mapped_type *meta;
  Id local_38;
  Id combined_image_sampler_id;
  Id sampler_id;
  Id image_id;
  Builder *builder;
  CallInst *pCStack_20;
  bool comparison_sampling;
  CallInst *instruction_local;
  Impl *impl_local;
  Op opcode_local;
  
  builder._7_1_ = opcode == SampleCmpGrad;
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  impl_local._0_4_ = opcode;
  if (((bool)builder._7_1_) ||
     (bVar2 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction), bVar2)) {
    _sampler_id = Converter::Impl::builder((Impl *)instruction_local);
    pCVar1 = instruction_local;
    pVVar7 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
    combined_image_sampler_id = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar7,0);
    pCVar1 = instruction_local;
    pVVar7 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,2);
    local_38 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar7,0);
    meta._4_4_ = Converter::Impl::build_sampled_image
                           ((Impl *)instruction_local,combined_image_sampler_id,local_38,
                            (bool)(builder._7_1_ & 1));
    _num_coords = std::
                  unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                  ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                                *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                   _M_rehash_policy._M_next_resize,&combined_image_sampler_id);
    image_ops = 0;
    local_50 = 0;
    bVar2 = get_image_dimensions
                      ((Impl *)instruction_local,combined_image_sampler_id,&image_ops,&local_50);
    if (bVar2) {
      coord[3] = 4;
      memset(offsets + 2,0,0x10);
      for (offsets[1] = 0; pCVar1 = instruction_local, offsets[1] < image_ops;
          offsets[1] = offsets[1] + 1) {
        pVVar7 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,offsets[1] + 3);
        IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar7,0);
        offsets[(ulong)offsets[1] + 2] = IVar3;
      }
      memset(&bias_id,0,0xc);
      bVar2 = get_texel_offsets((Impl *)instruction_local,pCStack_20,coord + 3,7,local_50,&bias_id,
                                false);
      if (bVar2) {
        uVar4 = 10;
        if ((builder._7_1_ & 1) != 0) {
          uVar4 = 0xb;
        }
        IVar3 = sample_grad_is_lod_bias((Impl *)instruction_local,pCStack_20,local_50,uVar4);
        memset(grad_y + 1,0,0xc);
        memset(&i_2,0,0xc);
        if (IVar3 == 0) {
          for (min_lod_argument_index = 0; pCVar1 = instruction_local,
              min_lod_argument_index < local_50; min_lod_argument_index = min_lod_argument_index + 1
              ) {
            pVVar7 = LLVMBC::Instruction::getOperand
                               (&pCStack_20->super_Instruction,min_lod_argument_index + uVar4);
            IVar5 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar7,0);
            grad_y[(ulong)min_lod_argument_index + 1] = IVar5;
          }
          for (aux_argument = 0; pCVar1 = instruction_local, aux_argument < local_50;
              aux_argument = aux_argument + 1) {
            pVVar7 = LLVMBC::Instruction::getOperand
                               (&pCStack_20->super_Instruction,aux_argument + uVar4 + 3);
            IVar5 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar7,0);
            (&i_2)[aux_argument] = IVar5;
          }
        }
        else {
          coord[3] = 1;
        }
        access_meta._4_4_ = 0x10;
        if ((builder._7_1_ & 1) != 0) {
          access_meta._4_4_ = 0x11;
        }
        access_meta._0_4_ = 0;
        pVVar7 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,access_meta._4_4_);
        bVar2 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar7);
        pCVar1 = instruction_local;
        if (!bVar2) {
          pVVar7 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,access_meta._4_4_)
          ;
          access_meta._0_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar7,0);
          coord[3] = coord[3] | 0x80;
          spv::Builder::addCapability(_sampler_id,CapabilityMinLod);
        }
        _texel_type = pCStack_20;
        local_b0 = std::
                   unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                   ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                                 *)&instruction_local[10].super_Instruction.attachments._M_h.
                                    _M_before_begin,(key_type *)&texel_type);
        sample_type._3_1_ = (local_b0->access_mask & 0x10) != 0;
        if ((bool)sample_type._3_1_) {
          spv::Builder::addCapability(_sampler_id,CapabilitySparseResidency);
        }
        sample_type._2_1_ =
             Converter::Impl::get_effective_typed_resource_type(_num_coords->component_type);
        uVar4 = 4;
        if ((builder._7_1_ & 1) != 0) {
          uVar4 = 1;
        }
        local_c4 = Converter::Impl::get_type_id
                             ((Impl *)instruction_local,sample_type._2_1_,1,uVar4,false);
        pCVar1 = instruction_local;
        local_c0 = local_c4;
        if ((sample_type._3_1_ & 1) != 0) {
          dref_id = spv::Builder::makeUintType(_sampler_id,0x20);
          local_f4 = local_c0;
          local_f0 = &dref_id;
          local_e8 = 2;
          __l._M_len = 2;
          __l._M_array = local_f0;
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                    (&local_e0,__l,(allocator_type *)((long)&spv_op + 3));
          local_c4 = Converter::Impl::get_struct_type((Impl *)pCVar1,&local_e0,0,"SparseTexel");
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                    (&local_e0);
        }
        pCVar1 = instruction_local;
        local_100 = 0;
        if ((builder._7_1_ & 1) == 0) {
          if (IVar3 == 0) {
            op._4_4_ = OpImageSampleExplicitLod;
            if ((sample_type._3_1_ & 1) != 0) {
              op._4_4_ = OpImageSparseSampleExplicitLod;
            }
          }
          else {
            op._4_4_ = OpImageSampleImplicitLod;
            if ((sample_type._3_1_ & 1) != 0) {
              op._4_4_ = OpImageSparseSampleImplicitLod;
            }
          }
        }
        else {
          if (IVar3 == 0) {
            op._4_4_ = OpImageSampleDrefExplicitLod;
            if ((sample_type._3_1_ & 1) != 0) {
              op._4_4_ = OpImageSparseSampleDrefExplicitLod;
            }
          }
          else {
            op._4_4_ = OpImageSampleDrefImplicitLod;
            if ((sample_type._3_1_ & 1) != 0) {
              op._4_4_ = OpImageSparseSampleDrefImplicitLod;
            }
          }
          pVVar7 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,10);
          local_100 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar7,0);
        }
        target_type = (Type *)Converter::Impl::allocate
                                        ((Impl *)instruction_local,op._4_4_,(Value *)pCStack_20,
                                         local_c4);
        pCVar1 = instruction_local;
        if ((sample_type._3_1_ & 1) == 0) {
          pTVar8 = LLVMBC::Value::getType((Value *)pCStack_20);
          pTVar8 = LLVMBC::Type::getStructElementType(pTVar8,0);
          Converter::Impl::decorate_relaxed_precision
                    ((Impl *)pCVar1,pTVar8,*(Id *)((long)&target_type->context + 4),true);
        }
        Operation::add_id((Operation *)target_type,meta._4_4_);
        pCVar1 = instruction_local;
        pTVar8 = target_type;
        IVar5 = spv::Builder::makeFloatType(_sampler_id,0x20);
        IVar5 = Converter::Impl::build_vector((Impl *)pCVar1,IVar5,offsets + 2,image_ops);
        Operation::add_id((Operation *)pTVar8,IVar5);
        if (local_100 != 0) {
          Operation::add_id((Operation *)target_type,local_100);
        }
        Operation::add_literal((Operation *)target_type,coord[3]);
        pCVar1 = instruction_local;
        pTVar8 = target_type;
        if ((coord[3] & 4) == 0) {
          if ((coord[3] & 1) != 0) {
            Operation::add_id((Operation *)target_type,IVar3);
          }
        }
        else {
          IVar3 = spv::Builder::makeFloatType(_sampler_id,0x20);
          IVar3 = Converter::Impl::build_vector((Impl *)pCVar1,IVar3,grad_y + 1,local_50);
          Operation::add_id((Operation *)pTVar8,IVar3);
          pCVar1 = instruction_local;
          pTVar8 = target_type;
          IVar3 = spv::Builder::makeFloatType(_sampler_id,0x20);
          IVar3 = Converter::Impl::build_vector((Impl *)pCVar1,IVar3,&i_2,local_50);
          Operation::add_id((Operation *)pTVar8,IVar3);
        }
        IVar3 = coord[3];
        IVar6 = spv::operator|(ImageOperandsConstOffsetMask,ImageOperandsOffsetMask);
        pTVar8 = target_type;
        if ((IVar3 & IVar6) != ImageOperandsMaskNone) {
          IVar3 = build_texel_offset_vector
                            ((Impl *)instruction_local,&bias_id,local_50,coord[3],false);
          Operation::add_id((Operation *)pTVar8,IVar3);
        }
        if ((coord[3] & 0x80) != 0) {
          Operation::add_id((Operation *)target_type,(Id)access_meta);
        }
        Converter::Impl::add((Impl *)instruction_local,(Operation *)target_type,false);
        pTVar8 = LLVMBC::Value::getType((Value *)pCStack_20);
        pTStack_118 = LLVMBC::Type::getStructElementType(pTVar8,0);
        if ((sample_type._3_1_ & 1) == 0) {
          if ((builder._7_1_ & 1) == 0) {
            Converter::Impl::fixup_load_type_typed
                      ((Impl *)instruction_local,_num_coords->component_type,4,(Value *)pCStack_20,
                       pTStack_118);
            build_exploded_composite_from_vector
                      ((Impl *)instruction_local,&pCStack_20->super_Instruction,4);
          }
          else {
            splat_op._4_4_ = *(uint *)((long)&target_type->context + 4);
            splat_op._3_1_ = _num_coords->component_type;
            Converter::Impl::fixup_load_type_typed
                      ((Impl *)instruction_local,(ComponentType *)((long)&splat_op + 3),1,
                       (Id *)((long)&splat_op + 4),pTStack_118);
            pCVar1 = instruction_local;
            this = _sampler_id;
            IVar3 = Converter::Impl::get_type_id((Impl *)instruction_local,pTStack_118,0);
            IVar3 = spv::Builder::makeVectorType(this,IVar3,4);
            local_128 = Converter::Impl::allocate((Impl *)pCVar1,OpCompositeConstruct,IVar3);
            local_148 = splat_op._4_4_;
            local_144 = splat_op._4_4_;
            local_140 = splat_op._4_4_;
            local_13c = splat_op._4_4_;
            local_138._M_array = &local_148;
            local_138._M_len = 4;
            Operation::add_ids(local_128,&local_138);
            Converter::Impl::add((Impl *)instruction_local,local_128,false);
            Converter::Impl::rewrite_value
                      ((Impl *)instruction_local,(Value *)pCStack_20,local_128->id);
          }
        }
        else {
          uVar4 = 4;
          if ((builder._7_1_ & 1) != 0) {
            uVar4 = 1;
          }
          Converter::Impl::repack_sparse_feedback
                    ((Impl *)instruction_local,_num_coords->component_type,uVar4,(Value *)pCStack_20
                     ,pTStack_118,0);
        }
        impl_local._7_1_ = true;
      }
      else {
        impl_local._7_1_ = false;
      }
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = true;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_sample_grad_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	bool comparison_sampling = opcode == DXIL::Op::SampleCmpGrad;

	// Elide dead loads.
	if (!comparison_sampling && !impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, comparison_sampling);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	uint32_t image_ops = spv::ImageOperandsGradMask;

	spv::Id coord[4] = {};
	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	spv::Id offsets[3] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 7, num_coords, offsets, false))
		return false;

	unsigned grad_argument_index = comparison_sampling ? 11 : 10;
	spv::Id bias_id = sample_grad_is_lod_bias(impl, instruction, num_coords, grad_argument_index);

	spv::Id grad_x[3] = {};
	spv::Id grad_y[3] = {};

	if (bias_id)
	{
		image_ops = spv::ImageOperandsBiasMask;
	}
	else
	{
		for (unsigned i = 0; i < num_coords; i++)
			grad_x[i] = impl.get_id_for_value(instruction->getOperand(i + grad_argument_index));
		for (unsigned i = 0; i < num_coords; i++)
			grad_y[i] = impl.get_id_for_value(instruction->getOperand(i + grad_argument_index + 3));
	}

	unsigned min_lod_argument_index = comparison_sampling ? 17 : 16;
	spv::Id aux_argument = 0;
	if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(min_lod_argument_index)))
	{
		aux_argument = impl.get_id_for_value(instruction->getOperand(min_lod_argument_index));
		image_ops |= spv::ImageOperandsMinLodMask;
		builder.addCapability(spv::CapabilityMinLod);
	}

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, comparison_sampling ? 1 : 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	spv::Id dref_id = 0;
	spv::Op spv_op;
	if (comparison_sampling)
	{
		if (bias_id)
			spv_op = sparse ? spv::OpImageSparseSampleDrefImplicitLod : spv::OpImageSampleDrefImplicitLod;
		else
			spv_op = sparse ? spv::OpImageSparseSampleDrefExplicitLod : spv::OpImageSampleDrefExplicitLod;

		dref_id = impl.get_id_for_value(instruction->getOperand(10));
	}
	else
	{
		if (bias_id)
			spv_op = sparse ? spv::OpImageSparseSampleImplicitLod : spv::OpImageSampleImplicitLod;
		else
			spv_op = sparse ? spv::OpImageSparseSampleExplicitLod : spv::OpImageSampleExplicitLod;
	}

	Operation *op = impl.allocate(spv_op, instruction, sample_type);

	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_id(combined_image_sampler_id);
	op->add_id(impl.build_vector(builder.makeFloatType(32), coord, num_coords_full));

	if (dref_id)
		op->add_id(dref_id);

	op->add_literal(image_ops);

	if (image_ops & spv::ImageOperandsGradMask)
	{
		op->add_id(impl.build_vector(builder.makeFloatType(32), grad_x, num_coords));
		op->add_id(impl.build_vector(builder.makeFloatType(32), grad_y, num_coords));
	}
	else if (image_ops & spv::ImageOperandsBiasMask)
		op->add_id(bias_id);

	if (image_ops & (spv::ImageOperandsConstOffsetMask | spv::ImageOperandsOffsetMask))
		op->add_id(build_texel_offset_vector(impl, offsets, num_coords, image_ops, false));

	if (image_ops & spv::ImageOperandsMinLodMask)
		op->add_id(aux_argument);

	impl.add(op);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
		impl.repack_sparse_feedback(meta.component_type, comparison_sampling ? 1 : 4, instruction, target_type);
	else if (comparison_sampling)
	{
		spv::Id loaded_id = op->id;
		auto tmp = meta.component_type;
		impl.fixup_load_type_typed(tmp, 1, loaded_id, target_type);
		Operation *splat_op =
			impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(impl.get_type_id(target_type), 4));
		splat_op->add_ids({ loaded_id, loaded_id, loaded_id, loaded_id });
		impl.add(splat_op);
		impl.rewrite_value(instruction, splat_op->id);
	}
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
		build_exploded_composite_from_vector(impl, instruction, 4);
	}
	return true;
}